

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O1

sljit_s32 sljit_emit_op_custom(sljit_compiler *compiler,void *instruction,sljit_s32 size)

{
  undefined1 *in_RAX;
  void *pvVar1;
  
  if (compiler->error == 0) {
    in_RAX = (undefined1 *)ensure_buf(compiler,(ulong)(size + 1));
    if (in_RAX != (undefined1 *)0x0) {
      *in_RAX = (char)size;
      compiler->size = compiler->size + (ulong)(uint)size;
      pvVar1 = memcpy(in_RAX + 1,instruction,(ulong)(uint)size);
      return (sljit_s32)pvVar1;
    }
  }
  return (sljit_s32)in_RAX;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_op_custom(struct sljit_compiler *compiler,
	void *instruction, sljit_s32 size)
{
	sljit_u8 *inst;

	CHECK_ERROR();
	CHECK(check_sljit_emit_op_custom(compiler, instruction, size));

	inst = (sljit_u8*)ensure_buf(compiler, 1 + size);
	FAIL_IF(!inst);
	INC_SIZE(size);
	SLJIT_MEMCPY(inst, instruction, size);
	return SLJIT_SUCCESS;
}